

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDfs.c
# Opt level: O3

int Ivy_ManSetLevels(Ivy_Man_t *p,int fHaig)

{
  byte *pbVar1;
  uint *puVar2;
  void *pvVar3;
  Ivy_Obj_t *pObj;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  
  pVVar4 = p->vObjs;
  iVar5 = pVVar4->nSize;
  if (fHaig != 0) {
    if (iVar5 < 1) {
      return 0;
    }
    lVar8 = 0;
    do {
      puVar2 = (uint *)pVVar4->pArray[lVar8];
      if ((puVar2 != (uint *)0x0) &&
         ((((puVar2[2] & 0xf) == 4 || ((puVar2[2] & 0xf) == 1)) && (*(long *)(puVar2 + 0x12) != 0)))
         ) {
        printf("CI %d has a choice, which will not be visualized.\n",(ulong)*puVar2);
        pVVar4 = p->vObjs;
      }
      lVar8 = lVar8 + 1;
      iVar5 = pVVar4->nSize;
    } while (lVar8 < iVar5);
  }
  if (0 < iVar5) {
    lVar8 = 0;
    do {
      if (pVVar4->pArray[lVar8] != (void *)0x0) {
        puVar2 = (uint *)((long)pVVar4->pArray[lVar8] + 8);
        *puVar2 = *puVar2 & 0x7ff;
        pVVar4 = p->vObjs;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar4->nSize);
    if (0 < pVVar4->nSize) {
      lVar8 = 0;
      uVar7 = 0;
      do {
        pvVar3 = pVVar4->pArray[lVar8];
        if ((pvVar3 != (void *)0x0) &&
           ((uVar6 = *(uint *)((long)pvVar3 + 8) & 0xf, uVar6 == 4 || (uVar6 == 2)))) {
          Ivy_ManSetLevels_rec
                    ((Ivy_Obj_t *)(*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe),fHaig);
          uVar6 = *(uint *)((*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) + 8) >> 0xb;
          if (uVar7 <= uVar6) {
            uVar7 = uVar6;
          }
          pVVar4 = p->vObjs;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < pVVar4->nSize);
      if (pVVar4->nSize < 1) {
        return uVar7;
      }
      lVar8 = 0;
      do {
        pObj = (Ivy_Obj_t *)pVVar4->pArray[lVar8];
        if (((pObj != (Ivy_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x8 & 0xf) - 5 < 3)) &&
           (pObj->nRefs == 0)) {
          Ivy_ManSetLevels_rec(pObj,fHaig);
          uVar6 = *(uint *)&pObj->field_0x8 >> 0xb;
          if (uVar7 <= uVar6) {
            uVar7 = uVar6;
          }
          pVVar4 = p->vObjs;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < pVVar4->nSize);
      if (0 < pVVar4->nSize) {
        lVar8 = 0;
        do {
          if (pVVar4->pArray[lVar8] != (void *)0x0) {
            pbVar1 = (byte *)((long)pVVar4->pArray[lVar8] + 8);
            *pbVar1 = *pbVar1 & 0xef;
            pVVar4 = p->vObjs;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < pVVar4->nSize);
        return uVar7;
      }
      return uVar7;
    }
  }
  return 0;
}

Assistant:

int Ivy_ManSetLevels( Ivy_Man_t * p, int fHaig )
{
    Ivy_Obj_t * pObj;
    int i, LevelMax;
    // check if CIs have choices
    if ( fHaig )
    {
        Ivy_ManForEachCi( p, pObj, i )
            if ( pObj->pEquiv )
                printf( "CI %d has a choice, which will not be visualized.\n", pObj->Id );
    }
    // clean the levels
    Ivy_ManForEachObj( p, pObj, i )
        pObj->Level = 0;
    // compute the levels
    LevelMax = 0;
    Ivy_ManForEachCo( p, pObj, i )
    {
        Ivy_ManSetLevels_rec( Ivy_ObjFanin0(pObj), fHaig );
        LevelMax = IVY_MAX( LevelMax, (int)Ivy_ObjFanin0(pObj)->Level );
    }
    // compute levels of nodes without fanout
    Ivy_ManForEachObj( p, pObj, i )
        if ( (Ivy_ObjIsNode(pObj) || Ivy_ObjIsBuf(pObj)) && Ivy_ObjRefs(pObj) == 0 )
        {
            Ivy_ManSetLevels_rec( pObj, fHaig );
            LevelMax = IVY_MAX( LevelMax, (int)pObj->Level );
        }
    // clean the marks
    Ivy_ManForEachObj( p, pObj, i )
        Ivy_ObjClearMarkA(pObj);
    return LevelMax;
}